

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void minor2inc(lua_State *L,global_State *g,lu_byte kind)

{
  global_State *pgVar1;
  GCObject **p;
  l_mem debt;
  GCObject **old;
  
  g->GCmajorminor = g->GCmarked;
  g->gckind = kind;
  g->survival = (GCObject *)0x0;
  g->old1 = (GCObject *)0x0;
  g->reallyold = (GCObject *)0x0;
  g->finobjsur = (GCObject *)0x0;
  g->finobjold1 = (GCObject *)0x0;
  g->finobjrold = (GCObject *)0x0;
  pgVar1 = L->l_G;
  pgVar1->gcstate = '\x03';
  p = &pgVar1->allgc;
  do {
    p = sweeplist(L,p,1);
  } while (p == &pgVar1->allgc);
  pgVar1->sweepgc = p;
  debt = luaO_applyparam(g->gcparams[5],100);
  luaE_setdebt(g,debt);
  return;
}

Assistant:

static void minor2inc (lua_State *L, global_State *g, lu_byte kind) {
  g->GCmajorminor = g->GCmarked;  /* number of live bytes */
  g->gckind = kind;
  g->reallyold = g->old1 = g->survival = NULL;
  g->finobjrold = g->finobjold1 = g->finobjsur = NULL;
  entersweep(L);  /* continue as an incremental cycle */
  /* set a debt equal to the step size */
  luaE_setdebt(g, applygcparam(g, STEPSIZE, 100));
}